

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O2

void __thiscall IRT::PrintVisitor::Visit(PrintVisitor *this,CJumpConditionalStatement *statement)

{
  PrintVisitor *this_00;
  int id;
  initializer_list<const_IRT::INode_*> __l;
  allocator local_139;
  _Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> local_138;
  string operationDescription;
  string local_100;
  string local_e0;
  string local_c0;
  ChildrenAnswers answers;
  vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> children;
  ChildrenAnswers local_58;
  
  answers.descriptions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CJumpConditionalStatement::LeftOperand(statement);
  answers.descriptions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)CJumpConditionalStatement::RightOperand(statement);
  answers.descriptions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)CJumpConditionalStatement::TrueLabel(statement);
  answers.ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CJumpConditionalStatement::FalseLabel(statement);
  __l._M_len = 4;
  __l._M_array = (iterator)&answers;
  std::vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>::vector
            (&children,__l,(allocator_type *)&operationDescription);
  std::vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>::vector
            ((vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> *)&local_138,&children
            );
  VisitChildren(&answers,this,
                (vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> *)&local_138);
  std::_Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>::~_Vector_base
            (&local_138);
  id = this->lastVisited + 1;
  this->lastVisited = id;
  local_139 = (allocator)CJumpConditionalStatement::Operation(statement);
  this_00 = (PrintVisitor *)
            std::
            map<IRT::enums::TLogicOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<IRT::enums::TLogicOperator>,_std::allocator<std::pair<const_IRT::enums::TLogicOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::at((map<IRT::enums::TLogicOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<IRT::enums::TLogicOperator>,_std::allocator<std::pair<const_IRT::enums::TLogicOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)maps::logicOperationToString_abi_cxx11_,(key_type *)&local_139);
  std::__cxx11::string::string((string *)&local_c0,(string *)this_00);
  ConstructLabel(&operationDescription,this_00,&local_c0,id);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string((string *)&local_e0,(string *)&operationDescription);
  ChildrenAnswers::PushBack(&answers,&local_e0,id);
  std::__cxx11::string::~string((string *)&local_e0);
  ChildrenAnswers::ChildrenAnswers(&local_58,&answers);
  AddChildrenAnswers(this,&local_58);
  ChildrenAnswers::~ChildrenAnswers(&local_58);
  std::__cxx11::string::string((string *)&local_100,"ConditionalJump",&local_139);
  AddLabel(this,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  this->lastVisited = this->lastVisited + 1;
  std::__cxx11::string::~string((string *)&operationDescription);
  ChildrenAnswers::~ChildrenAnswers(&answers);
  std::_Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>::~_Vector_base
            (&children.super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>);
  return;
}

Assistant:

void IRT::PrintVisitor::Visit( const IRT::CJumpConditionalStatement &statement ) {
    std::vector<const IRT::INode *> children = { statement.LeftOperand( ), statement.RightOperand( ),
                                                 statement.TrueLabel( ), statement.FalseLabel( ) };
    ChildrenAnswers answers = VisitChildren( children );

    int operationId = ++lastVisited;
    std::string operationDescription = ConstructLabel( IRT::maps::logicOperationToString.at( statement.Operation( )),
                                                       operationId );
    answers.PushBack( operationDescription, operationId );

    AddChildrenAnswers( answers );
    AddLabel( "ConditionalJump" );
    ++lastVisited;
}